

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O3

iterator __thiscall
phmap::priv::
btree<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::NonTransparentCompare,std::allocator<std::__cxx11::string>,256,true>>
::internal_find<std::__cxx11::string>
          (btree<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::NonTransparentCompare,std::allocator<std::__cxx11::string>,256,true>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
  *pbVar1;
  ulong uVar2;
  SearchResult<int,_false> SVar3;
  int iVar4;
  key_compare *in_RDX;
  key_compare *comp;
  iterator iVar5;
  
  SVar3 = btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::NonTransparentCompare,std::allocator<std::__cxx11::string>,256,true>>
          ::lower_bound<std::__cxx11::string>
                    ((btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::NonTransparentCompare,std::allocator<std::__cxx11::string>,256,true>>
                      *)this,key,in_RDX);
  uVar2 = (ulong)this & 7;
  while (uVar2 == 0) {
    if (((btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
          *)this)[0xb] !=
        (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
         )0x0) goto LAB_001a26a7;
    this = (btree<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::NonTransparentCompare,std::allocator<std::__cxx11::string>,256,true>>
            *)btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
              ::child((btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                       *)this,(long)SVar3.value);
    SVar3 = btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::NonTransparentCompare,std::allocator<std::__cxx11::string>,256,true>>
            ::lower_bound<std::__cxx11::string>
                      ((btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::NonTransparentCompare,std::allocator<std::__cxx11::string>,256,true>>
                        *)this,key,comp);
    uVar2 = (ulong)this & 7;
  }
LAB_001a2673:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::NonTransparentCompare, std::allocator<std::basic_string<char>>, 256, true>> *, unsigned char, std::basic_string<char>, phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::NonTransparentCompare, std::allocator<std::basic_string<char>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::NonTransparentCompare, std::allocator<std::basic_string<char>>, 256, true>> *, unsigned char, std::basic_string<char>, phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::NonTransparentCompare, std::allocator<std::basic_string<char>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
               );
LAB_001a26a7:
  if (((ulong)this & 7) != 0) goto LAB_001a2673;
  if (SVar3.value !=
      (uint)(byte)((btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                    *)this)[10]) {
    iVar4 = std::__cxx11::string::compare((string *)key);
    if (-1 < iVar4) goto LAB_001a26d5;
    goto LAB_001a26d0;
  }
  pbVar1 = *(btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
             **)this;
  if (((ulong)pbVar1 & 7) != 0) goto LAB_001a2673;
  SVar3.value = (int)(byte)((btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                             *)this)[8];
  this = (btree<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::NonTransparentCompare,std::allocator<std::__cxx11::string>,256,true>>
          *)pbVar1;
  if (pbVar1[0xb] !=
      (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
       )0x0) {
LAB_001a26d0:
    SVar3.value = 0;
    this = (btree<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::NonTransparentCompare,std::allocator<std::__cxx11::string>,256,true>>
            *)0x0;
LAB_001a26d5:
    iVar5.position = SVar3.value;
    iVar5.node = (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::NonTransparentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                  *)this;
    iVar5._12_4_ = 0;
    return iVar5;
  }
  goto LAB_001a26a7;
}

Assistant:

auto btree<P>::internal_find(const K &key) const -> iterator {
        auto res = internal_locate(key);
        if (res.HasMatch()) {
            if (res.IsEq()) {
                return res.value;
            }
        } else {
            const iterator iter = internal_last(res.value);
            if (iter.node != nullptr && !compare_keys(key, iter.key())) {
                return iter;
            }
        }
        return {nullptr, 0};
    }